

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_free(archive_write *a)

{
  pax *pax_00;
  pax *pax;
  archive_write *a_local;
  
  pax_00 = (pax *)a->format_data;
  if (pax_00 != (pax *)0x0) {
    archive_string_free(&pax_00->pax_header);
    archive_string_free(&pax_00->sparse_map);
    archive_string_free(&pax_00->l_url_encoded_name);
    sparse_list_clear(pax_00);
    free(pax_00);
    a->format_data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_write_pax_free(struct archive_write *a)
{
	struct pax *pax;

	pax = (struct pax *)a->format_data;
	if (pax == NULL)
		return (ARCHIVE_OK);

	archive_string_free(&pax->pax_header);
	archive_string_free(&pax->sparse_map);
	archive_string_free(&pax->l_url_encoded_name);
	sparse_list_clear(pax);
	free(pax);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}